

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Board *pBVar1;
  IBoard *pIVar2;
  pointer plVar3;
  uint uVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  Board *this;
  pointer plVar11;
  vector<uttt::IBoard,std::allocator<uttt::IBoard>> *this_00;
  vector<ttt::Board,std::allocator<ttt::Board>> *this_01;
  IBoard *this_02;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  initializer_list<ttt::Board> __l;
  initializer_list<uttt::IBoard> __l_00;
  int local_bc;
  vector<long,_std::allocator<long>_> moves;
  long m;
  vector<ttt::Board,_std::allocator<ttt::Board>_> levels [2];
  IBoard local_48;
  
  BoardTest<ttt::Board>();
  BoardTest<uttt::IBoard>();
  UtttHashTest();
  MCTSTest<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(ttt::Board_const&,long_long)>
            (mcts::MCTS<ttt::Board,mcts::RandomPlayout<ttt::Board>>,100000);
  MCTSTest<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(ttt::Board_const&,long_long)>
            (mcts::MCTS_parallel<ttt::Board,mcts::RandomPlayout<ttt::Board>>,100000);
  MCTSTest<ttt::Board,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(ttt::Board_const&,long_long)>
            (mcts::MCTS_cache<ttt::Board,mcts::RandomPlayout<ttt::Board>>,100000);
  MCTSTest<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(uttt::IBoard_const&,long_long)>
            (mcts::MCTS<uttt::IBoard,uttt::RandomPlayout>,100000);
  MCTSTest<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(uttt::IBoard_const&,long_long)>
            (mcts::MCTS_parallel<uttt::IBoard,uttt::RandomPlayout>,100000);
  MCTSTest<uttt::IBoard,std::vector<mcts::MCTSResults,std::allocator<mcts::MCTSResults>>(&)(uttt::IBoard_const&,long_long)>
            (mcts::MCTS_cache<uttt::IBoard,uttt::RandomPlayout>,100000);
  ManagerTest<ttt::Board,mcts::RandomPlayout<ttt::Board>>();
  ManagerTest<uttt::IBoard,uttt::RandomPlayout>();
  CountTest<ttt::Board>(10);
  CountTest<uttt::IBoard>(10);
  poVar6 = std::operator<<((ostream *)&std::cout,"Game size: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6," bytes\n");
  ttt::Board::Board((Board *)&moves);
  __l._M_len = 1;
  __l._M_array = (iterator)&moves;
  std::vector<ttt::Board,_std::allocator<ttt::Board>_>::vector
            (levels,__l,(allocator_type *)&local_48);
  levels[1].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  levels[1].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  levels[1].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc = 0;
  uVar10 = 0;
  while (local_bc != 10) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Working on depth: ");
    local_bc = local_bc + 1;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_bc);
    std::operator<<(poVar6,'\n');
    uVar4 = 1 - uVar10;
    this_01 = (vector<ttt::Board,std::allocator<ttt::Board>> *)(levels + uVar4);
    if (levels[uVar4].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
        super__Vector_impl_data._M_finish != *(pointer *)this_01) {
      levels[uVar4].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
      super__Vector_impl_data._M_finish = *(pointer *)this_01;
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    pBVar1 = levels[uVar10].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this = levels[uVar10].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
                super__Vector_impl_data._M_start; this != pBVar1; this = this + 1) {
      iVar5 = ttt::Board::GetStatus(this);
      if (iVar5 == -1) {
        ttt::Board::GetPossibleMoves(&moves,this);
        plVar3 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (plVar11 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start; plVar11 != plVar3; plVar11 = plVar11 + 1) {
          m = *plVar11;
          local_48.micro._M_elems[2] = *(short *)((this->board)._M_elems[2]._M_elems + 2);
          local_48._0_8_ = *(undefined8 *)(this->board)._M_elems;
          ttt::Board::ApplyMove((Board *)&local_48,&m);
          std::vector<ttt::Board,std::allocator<ttt::Board>>::emplace_back<ttt::Board&>
                    (this_01,(Board *)&local_48);
        }
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  (&moves.super__Vector_base<long,_std::allocator<long>_>);
      }
    }
    lVar8 = std::chrono::_V2::system_clock::now();
    poVar6 = std::operator<<((ostream *)&std::cout,"Current depth count: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,", size: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,"MB\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"Total count: ");
    poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
    poVar6 = std::operator<<(poVar6,", size: ");
    poVar6 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar6);
    std::operator<<(poVar6," MB\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"Duration: ");
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    poVar6 = std::operator<<(poVar6," seconds ");
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::operator<<(poVar6," milliseconds, ");
    lVar9 = ((long)levels[uVar4].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl
                   .super__Vector_impl_data._M_finish - *(long *)this_01) / 10;
    auVar12._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = 0x45300000;
    poVar6 = std::ostream::_M_insert<double>
                       ((((auVar12._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
                        (double)((lVar8 - lVar7) / 1000000)) * 1000.0);
    std::operator<<(poVar6," nps\n");
    uVar10 = uVar4;
  }
  lVar7 = 0x18;
  do {
    std::_Vector_base<ttt::Board,_std::allocator<ttt::Board>_>::~_Vector_base
              ((_Vector_base<ttt::Board,_std::allocator<ttt::Board>_> *)
               ((long)&levels[0].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  poVar6 = std::operator<<((ostream *)&std::cout,"Game size: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6," bytes\n");
  uttt::IBoard::IBoard((IBoard *)&moves);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&moves;
  std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
            ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)levels,__l_00,
             (allocator_type *)&local_48);
  levels[1].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  levels[1].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  levels[1].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc = 0;
  uVar10 = 0;
  while (local_bc != 10) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Working on depth: ");
    local_bc = local_bc + 1;
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_bc);
    std::operator<<(poVar6,'\n');
    uVar4 = 1 - uVar10;
    this_00 = (vector<uttt::IBoard,std::allocator<uttt::IBoard>> *)(levels + uVar4);
    if (levels[uVar4].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
        super__Vector_impl_data._M_finish != *(pointer *)this_00) {
      levels[uVar4].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
      super__Vector_impl_data._M_finish = *(pointer *)this_00;
    }
    lVar7 = std::chrono::_V2::system_clock::now();
    pIVar2 = (IBoard *)
             levels[uVar10].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_02 = (IBoard *)
                   levels[uVar10].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_02 != pIVar2;
        this_02 = this_02 + 1) {
      iVar5 = uttt::IBoard::GetStatus(this_02);
      if (iVar5 == -1) {
        uttt::IBoard::GetPossibleMoves(&moves,this_02);
        plVar3 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (plVar11 = moves.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start; plVar11 != plVar3; plVar11 = plVar11 + 1) {
          m = *plVar11;
          local_48._16_8_ = *(undefined8 *)((this_02->micro)._M_elems + 6);
          local_48.macro = this_02->macro;
          local_48.micro._M_elems[0] = (this_02->micro)._M_elems[0];
          local_48.micro._M_elems[1] = (this_02->micro)._M_elems[1];
          local_48.micro._M_elems._4_8_ = *(undefined8 *)((this_02->micro)._M_elems + 2);
          uttt::IBoard::ApplyMove(&local_48,&m);
          std::vector<uttt::IBoard,std::allocator<uttt::IBoard>>::emplace_back<uttt::IBoard&>
                    (this_00,&local_48);
        }
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                  (&moves.super__Vector_base<long,_std::allocator<long>_>);
      }
    }
    lVar8 = std::chrono::_V2::system_clock::now();
    poVar6 = std::operator<<((ostream *)&std::cout,"Current depth count: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,", size: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,"MB\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"Total count: ");
    poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
    poVar6 = std::operator<<(poVar6,", size: ");
    poVar6 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar6);
    std::operator<<(poVar6," MB\n");
    poVar6 = std::operator<<((ostream *)&std::cout,"Duration: ");
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    poVar6 = std::operator<<(poVar6," seconds ");
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    std::operator<<(poVar6," milliseconds, ");
    lVar9 = ((long)levels[uVar4].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl
                   .super__Vector_impl_data._M_finish - *(long *)this_00) / 0x18;
    auVar13._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar13._0_8_ = lVar9;
    auVar13._12_4_ = 0x45300000;
    poVar6 = std::ostream::_M_insert<double>
                       ((((auVar13._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) /
                        (double)((lVar8 - lVar7) / 1000000)) * 1000.0);
    std::operator<<(poVar6," nps\n");
    uVar10 = uVar4;
  }
  lVar7 = 0x18;
  do {
    std::_Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>::~_Vector_base
              ((_Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)
               ((long)&levels[0].super__Vector_base<ttt::Board,_std::allocator<ttt::Board>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  BotTest<generic_bots::MinimaxBot<ttt::Board,minimax::ABeta<ttt::Board,minimax::Eval<ttt::Board>>>,ttt::Board>
            ();
  BotTest<generic_bots::MinimaxBot<uttt::IBoard,minimax::ABeta<uttt::IBoard,uttt::Eval1>>,uttt::IBoard>
            ();
  CountUniqueBoardPositions<ttt::Board>(0x14);
  CountUniqueBoardPositions<uttt::IBoard>(0x14);
  std::__cxx11::string::string((string *)levels,"/mnt/e/uttt_data",(allocator *)&moves);
  explorer::Explore<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>((string *)levels);
  std::__cxx11::string::~string((string *)levels);
  ReaderWriterTest<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>(10000000);
  return 0;
}

Assistant:

int main()
{
    BoardTest<ttt::Board>();
    BoardTest<uttt::IBoard>();

    UtttHashTest();

    MCTSTest<ttt::Board>(mcts::MCTS<ttt::Board>, 100000);
    MCTSTest<ttt::Board>(mcts::MCTS_parallel<ttt::Board>, 100000);
    MCTSTest<ttt::Board>(mcts::MCTS_cache<ttt::Board>, 100000);
    MCTSTest<uttt::IBoard>(mcts::MCTS<uttt::IBoard, uttt::RandomPlayout>, 100000);
    MCTSTest<uttt::IBoard>(mcts::MCTS_parallel<uttt::IBoard, uttt::RandomPlayout>, 100000);
    MCTSTest<uttt::IBoard>(mcts::MCTS_cache<uttt::IBoard, uttt::RandomPlayout>, 100000);

    ManagerTest<ttt::Board>();
    ManagerTest<uttt::IBoard, uttt::RandomPlayout>();

    CountTest<ttt::Board>(10);
    CountTest<uttt::IBoard>(10);
    CountBFS<ttt::Board>(10);
    CountBFS<uttt::IBoard>(10);

    BotTest<generic_bots::MinimaxBot<ttt::Board, minimax::ABeta<ttt::Board>>, ttt::Board>();
    BotTest<generic_bots::MinimaxBot<uttt::IBoard, minimax::ABeta<uttt::IBoard, uttt::Eval1>>, uttt::IBoard>();

    CountUniqueBoardPositions<ttt::Board>(20);
    CountUniqueBoardPositions<uttt::IBoard>(20);

    ExplorerTest<uttt::IBoard, uttt::IBoardReader, uttt::IBoardWriter, uttt::IBoardSize>("/mnt/e/uttt_data");
    ReaderWriterTest<uttt::IBoard, uttt::IBoardReader, uttt::IBoardWriter, uttt::IBoardSize>(10000000);
}